

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void sznet::net::detail::removeConnection(EventLoop *loop,TcpConnectionPtr *conn)

{
  code *local_68;
  undefined8 local_60;
  type local_58;
  Functor local_38;
  TcpConnectionPtr *local_18;
  TcpConnectionPtr *conn_local;
  EventLoop *loop_local;
  
  local_68 = TcpConnection::connectDestroyed;
  local_60 = 0;
  local_18 = conn;
  conn_local = (TcpConnectionPtr *)loop;
  std::bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>const&>
            (&local_58,(offset_in_TcpConnection_to_subr *)&local_68,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
            ((function<void()> *)&local_38,&local_58);
  EventLoop::queueInLoop(loop,&local_38);
  std::function<void_()>::~function(&local_38);
  std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
  ~_Bind(&local_58);
  return;
}

Assistant:

void removeConnection(EventLoop* loop, const TcpConnectionPtr& conn)
{
	loop->queueInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
}